

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpf_common_sse2.h
# Opt level: O0

void highbd_transpose4x8_8x4_sse2
               (__m128i *x0,__m128i *x1,__m128i *x2,__m128i *x3,__m128i *d0,__m128i *d1,__m128i *d2,
               __m128i *d3,__m128i *d4,__m128i *d5,__m128i *d6,__m128i *d7)

{
  __m128i *in_RCX;
  __m128i *in_RDX;
  __m128i *in_RSI;
  __m128i *in_RDI;
  __m128i *in_R8;
  __m128i *in_R9;
  __m128i *in_stack_00000008;
  __m128i *in_stack_00000010;
  
  highbd_transpose4x8_8x4_low_sse2
            (in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_stack_00000008,in_stack_00000010);
  highbd_transpose4x8_8x4_high_sse2(in_RDI,in_RSI,in_RDX,in_RCX,d1,d0,x3,x2);
  return;
}

Assistant:

static inline void highbd_transpose4x8_8x4_sse2(__m128i *x0, __m128i *x1,
                                                __m128i *x2, __m128i *x3,
                                                __m128i *d0, __m128i *d1,
                                                __m128i *d2, __m128i *d3,
                                                __m128i *d4, __m128i *d5,
                                                __m128i *d6, __m128i *d7) {
  // input
  // x0 00 01 02 03 04 05 06 07
  // x1 10 11 12 13 14 15 16 17
  // x2 20 21 22 23 24 25 26 27
  // x3 30 31 32 33 34 35 36 37
  // output
  // 00 10 20 30 xx xx xx xx
  // 01 11 21 31 xx xx xx xx
  // 02 12 22 32 xx xx xx xx
  // 03 13 23 33 xx xx xx xx
  // 04 14 24 34 xx xx xx xx
  // 05 15 25 35 xx xx xx xx
  // 06 16 26 36 xx xx xx xx
  // 07 17 27 37 xx xx xx xx
  highbd_transpose4x8_8x4_low_sse2(x0, x1, x2, x3, d0, d1, d2, d3);
  highbd_transpose4x8_8x4_high_sse2(x0, x1, x2, x3, d4, d5, d6, d7);
}